

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O3

void __thiscall CVmObjFrameRef::mark_refs(CVmObjFrameRef *this,uint state)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  vm_obj_id_t *pvVar4;
  
  pcVar2 = (this->super_CVmObject).ext_;
  if (*(int *)(pcVar2 + 8) == 5) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar2 + 0x10),state);
  }
  if (*(int *)(pcVar2 + 0x28) == 5) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar2 + 0x30),state);
  }
  if (*(vm_obj_id_t *)(pcVar2 + 0x38) != 0) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar2 + 0x38),state);
  }
  if (*(vm_obj_id_t *)(pcVar2 + 0x3c) != 0) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar2 + 0x3c),state);
  }
  if (*(int *)(pcVar2 + 0x48) == 5) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar2 + 0x50),state);
  }
  iVar3 = *(int *)(pcVar2 + 0x20);
  iVar1 = *(int *)(pcVar2 + 0x24);
  if (iVar1 + iVar3 != 0 && SCARRY4(iVar1,iVar3) == iVar1 + iVar3 < 0) {
    pvVar4 = (vm_obj_id_t *)(pcVar2 + 0x60);
    iVar3 = iVar3 + iVar1 + 1;
    do {
      if (pvVar4[-2] == 5) {
        CVmObjTable::add_to_gc_queue(&G_obj_table_X,*pvVar4,state);
      }
      pvVar4 = pvVar4 + 4;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

void CVmObjFrameRef::mark_refs(VMG_ uint state)
{
    /* get the extension */
    vm_frameref_ext *ext = get_ext();

    /* mark the function */
    if (ext->entry.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->entry.val.obj, state);

    /* mark the method context objects */
    if (ext->self.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->self.val.obj, state);
    if (ext->defobj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(ext->defobj, state);
    if (ext->targobj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(ext->targobj, state);

    /* mark the invokee */
    if (ext->invokee.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->invokee.val.obj, state);

    /* mark each snapshot variable */
    int i;
    const vm_val_t *v;
    for (i = ext->nlocals + ext->nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        if (v->typ == VM_OBJ)
            G_obj_table->mark_all_refs(v->val.obj, state);
    }
}